

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

int coda_data_dictionary_add_product_class(coda_product_class *product_class)

{
  long lVar1;
  coda_product_class *pcVar2;
  int iVar3;
  void *pvVar4;
  coda_product_class *temp;
  int *piVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + -0x11f0) == 0) {
    coda_set_error(-400,"coda has not been initialized");
  }
  else {
    iVar3 = coda_hashtable_add_name
                      (*(hashtable **)(*(long *)(in_FS_OFFSET + -0x11f0) + 0x10),product_class->name
                      );
    if (iVar3 == 0) {
      piVar5 = *(int **)(in_FS_OFFSET + -0x11f0);
      if (((long)*piVar5 & 0xfU) == 0) {
        pvVar4 = realloc(*(void **)(piVar5 + 2),(long)*piVar5 * 8 + 0x80);
        piVar5 = *(int **)(in_FS_OFFSET + -0x11f0);
        if (pvVar4 == (void *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                         (long)*piVar5 * 8 + 0x80,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                         ,0x3e2);
          return -1;
        }
        *(void **)(piVar5 + 2) = pvVar4;
      }
      lVar6 = 0;
      while( true ) {
        iVar3 = *piVar5;
        if (iVar3 <= lVar6) break;
        lVar1 = *(long *)(piVar5 + 2);
        pcVar2 = *(coda_product_class **)(lVar1 + lVar6 * 8);
        iVar3 = strcmp(product_class->name,pcVar2->name);
        if (iVar3 < 0) {
          *(coda_product_class **)(lVar1 + lVar6 * 8) = product_class;
          piVar5 = *(int **)(in_FS_OFFSET + -0x11f0);
          product_class = pcVar2;
        }
        lVar6 = lVar6 + 1;
      }
      *piVar5 = iVar3 + 1;
      *(coda_product_class **)(*(long *)(piVar5 + 2) + (long)iVar3 * 8) = product_class;
      iVar3 = data_dictionary_rebuild_product_class_hash_data();
      return -(uint)(iVar3 != 0);
    }
    coda_set_error(-400,"duplicate product class %s",product_class->name);
  }
  return -1;
}

Assistant:

int coda_data_dictionary_add_product_class(coda_product_class *product_class)
{
    int i;

    if (coda_global_data_dictionary == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "coda has not been initialized");
        return -1;
    }

    if (hashtable_add_name(coda_global_data_dictionary->hash_data, product_class->name) != 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "duplicate product class %s", product_class->name);
        return -1;
    }
    if (coda_global_data_dictionary->num_product_classes % BLOCK_SIZE == 0)
    {
        coda_product_class **new_product_class;

        new_product_class = realloc(coda_global_data_dictionary->product_class,
                                    (coda_global_data_dictionary->num_product_classes + BLOCK_SIZE) *
                                    sizeof(coda_product_class *));
        if (new_product_class == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (coda_global_data_dictionary->num_product_classes + BLOCK_SIZE) *
                           sizeof(coda_product_class *), __FILE__, __LINE__);
            return -1;
        }
        coda_global_data_dictionary->product_class = new_product_class;
    }
    /* add sorted */
    for (i = 0; i < coda_global_data_dictionary->num_product_classes; i++)
    {
        if (strcmp(product_class->name, coda_global_data_dictionary->product_class[i]->name) < 0)
        {
            coda_product_class *temp = product_class;

            product_class = coda_global_data_dictionary->product_class[i];
            coda_global_data_dictionary->product_class[i] = temp;
        }
    }
    coda_global_data_dictionary->num_product_classes++;
    coda_global_data_dictionary->product_class[coda_global_data_dictionary->num_product_classes - 1] = product_class;

    /* rebuild hashtable (since we use a sorted insert) */
    if (data_dictionary_rebuild_product_class_hash_data() != 0)
    {
        return -1;
    }

    return 0;
}